

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O2

ostream * toml::operator<<(ostream *os,integer_format f)

{
  ostream *poVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  uVar2 = CONCAT71(in_register_00000031,f) & 0xffffffff;
  switch(uVar2) {
  case 0:
    pcVar3 = "dec";
    break;
  case 1:
    pcVar3 = "bin";
    break;
  case 2:
    pcVar3 = "oct";
    break;
  case 3:
    pcVar3 = "hex";
    break;
  default:
    poVar1 = std::operator<<((ostream *)os,"unknown integer_format: ");
    std::operator<<(poVar1,(char)uVar2);
    return os;
  }
  std::operator<<((ostream *)os,pcVar3);
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const integer_format f)
{
    switch(f)
    {
        case integer_format::dec: {os << "dec"; break;}
        case integer_format::bin: {os << "bin"; break;}
        case integer_format::oct: {os << "oct"; break;}
        case integer_format::hex: {os << "hex"; break;}
        default:
        {
            os << "unknown integer_format: " << static_cast<std::uint8_t>(f);
            break;
        }
    }
    return os;
}